

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O0

void __thiscall
leveldb::(anonymous_namespace)::Repairer::ConvertLogToTable(unsigned_long)::LogReporter::
Corruption(unsigned_long,leveldb::Status_const__(LogReporter *this,size_t bytes,Status *s)

{
  Logger *info_log;
  undefined8 uVar1;
  undefined8 uVar2;
  uint in_ESI;
  long in_RDI;
  Status *in_stack_00000008;
  string local_38 [56];
  
  info_log = *(Logger **)(in_RDI + 0x10);
  uVar1 = *(undefined8 *)(in_RDI + 0x18);
  Status::ToString_abi_cxx11_(in_stack_00000008);
  uVar2 = std::__cxx11::string::c_str();
  Log(info_log,"Log #%llu: dropping %d bytes; %s",uVar1,(ulong)in_ESI,uVar2);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& s) override {
        // We print error messages for corruption, but continue repairing.
        Log(info_log, "Log #%llu: dropping %d bytes; %s",
            (unsigned long long)lognum, static_cast<int>(bytes),
            s.ToString().c_str());
      }